

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::Array2D<double>::Array2D(Array2D<double> *this,Bounds2i *extent,Allocator allocator)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double *__s;
  
  TVar1 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar1;
  (this->allocator).memoryResource = allocator.memoryResource;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  auVar5 = vpsubd_avx(auVar4,auVar5);
  auVar4 = vpshufd_avx(auVar5,0x55);
  auVar4 = vpmulld_avx(auVar4,auVar5);
  uVar3 = auVar4._0_4_;
  if (uVar3 == 0) {
    __s = (double *)0x0;
  }
  else {
    iVar2 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                      (allocator.memoryResource,(long)(int)uVar3 << 3,8);
    __s = (double *)CONCAT44(extraout_var,iVar2);
  }
  this->values = __s;
  if (0 < (int)uVar3) {
    memset(__s,0,(ulong)uVar3 << 3);
    return;
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, Allocator allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }